

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O1

QDataStream * QtPrivate::readArrayBasedContainer<QList<int>>(QDataStream *s,QList<int> *c)

{
  QDataStream QVar1;
  QDataStream QVar2;
  char cVar3;
  undefined1 *asize;
  long in_FS_OFFSET;
  qint64 extendedLen;
  quint32 first;
  undefined1 *local_48;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar1 = s[0x13];
  cVar3 = QDataStream::isDeviceTransactionStarted();
  if (cVar3 == '\0') {
    QDataStream::resetStatus();
  }
  QList<int>::clear(c);
  local_3c = 0xaaaaaaaa;
  QDataStream::operator>>(s,(int *)&local_3c);
  asize = (undefined1 *)(ulong)local_3c;
  if (asize == (undefined1 *)0xffffffff) {
    asize = (undefined1 *)0xffffffffffffffff;
  }
  else if ((local_3c == 0xfffffffe) && (0x15 < *(int *)(s + 0x18))) {
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    QDataStream::operator>>(s,(longlong *)&local_48);
    asize = local_48;
  }
  if ((long)asize < 0) {
    QDataStream::setStatus((Status)s);
  }
  else {
    QList<int>::reserve(c,(qsizetype)asize);
    if (asize != (undefined1 *)0x0) {
      do {
        asize = asize + -1;
        local_3c = 0xaaaaaaaa;
        QDataStream::operator>>(s,(int *)&local_3c);
        QVar2 = s[0x13];
        if (QVar2 == (QDataStream)0x0) {
          local_48 = (undefined1 *)CONCAT44(local_48._4_4_,local_3c);
          QPodArrayOps<int>::emplace<int&>((QPodArrayOps<int> *)c,(c->d).size,(int *)&local_48);
          QList<int>::end(c);
        }
        else {
          QList<int>::clear(c);
        }
      } while ((QVar2 == (QDataStream)0x0) && (asize != (undefined1 *)0x0));
    }
  }
  if (QVar1 != (QDataStream)0x0) {
    QDataStream::resetStatus();
    QDataStream::setStatus((Status)s);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return s;
}

Assistant:

QDataStream &readArrayBasedContainer(QDataStream &s, Container &c)
{
    StreamStateSaver stateSaver(&s);

    c.clear();
    qint64 size = QDataStream::readQSizeType(s);
    qsizetype n = size;
    if (size != n || size < 0) {
        s.setStatus(QDataStream::SizeLimitExceeded);
        return s;
    }
    c.reserve(n);
    for (qsizetype i = 0; i < n; ++i) {
        typename Container::value_type t;
        s >> t;
        if (s.status() != QDataStream::Ok) {
            c.clear();
            break;
        }
        c.append(t);
    }

    return s;
}